

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

int get_max_row_mt_workers_per_tile(AV1_COMMON *cm,TileInfo *tile)

{
  int iVar1;
  int iVar2;
  TileInfo *in_RSI;
  AV1_COMMON *in_RDI;
  int max_workers;
  int sb_rows;
  
  iVar1 = av1_get_sb_rows_in_tile(in_RDI,in_RSI);
  iVar2 = 2;
  if (iVar1 == 1) {
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static inline int get_max_row_mt_workers_per_tile(AV1_COMMON *cm,
                                                  const TileInfo *tile) {
  // NOTE: Currently value of max workers is calculated based
  // on the parse and decode time. As per the theoretical estimate
  // when percentage of parse time is equal to percentage of decode
  // time, number of workers needed to parse + decode a tile can not
  // exceed more than 2.
  // TODO(any): Modify this value if parsing is optimized in future.
  int sb_rows = av1_get_sb_rows_in_tile(cm, tile);
  int max_workers =
      sb_rows == 1 ? AOM_MIN_THREADS_PER_TILE : AOM_MAX_THREADS_PER_TILE;
  return max_workers;
}